

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::iterate(DefaultsTest *this)

{
  PFNGLGETNAMEDBUFFERPARAMETERI64V p_Var1;
  PFNGLNAMEDBUFFERDATA p_Var2;
  GLchar *pGVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined4 *puVar11;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar12;
  undefined1 auVar13 [16];
  GLuint buffer;
  GLint data;
  GLuint local_44;
  undefined1 *local_40;
  long local_38;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var_00,iVar10);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar8) || (bVar9)) {
    local_44 = 0;
    iVar10 = *(int *)(lVar12 + 0x8f8);
    iVar5 = *(int *)(lVar12 + 0x8fc);
    iVar6 = *(int *)(lVar12 + 0x900);
    iVar7 = *(int *)(lVar12 + 0x904);
    p_Var1 = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar12 + 0x8f0);
    p_Var2 = *(PFNGLNAMEDBUFFERDATA *)(lVar12 + 0xec0);
    *(int *)&this->m_pGetNamedBufferParameteriv = iVar10;
    *(int *)((long)&this->m_pGetNamedBufferParameteriv + 4) = iVar5;
    *(int *)&this->m_pGetNamedBufferPointerv = iVar6;
    *(int *)((long)&this->m_pGetNamedBufferPointerv + 4) = iVar7;
    this->m_pNamedBufferData = p_Var2;
    this->m_pGetNamedBufferParameteri64v = p_Var1;
    auVar13._0_4_ = -(uint)((int)((ulong)p_Var2 >> 0x20) == 0 && (int)p_Var2 == 0);
    auVar13._4_4_ = -(uint)((int)p_Var1 == 0 && (int)((ulong)p_Var1 >> 0x20) == 0);
    auVar13._8_4_ = -(uint)(iVar5 == 0 && iVar10 == 0);
    auVar13._12_4_ = -(uint)(iVar6 == 0 && iVar7 == 0);
    iVar10 = movmskps((int)CONCAT71(extraout_var,bVar9),auVar13);
    local_38 = lVar12;
    if (iVar10 != 0) {
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&int::typeinfo,0);
    }
    (**(code **)(lVar12 + 0x3b8))(1,&local_44);
    err = (**(code **)(lVar12 + 0x800))();
    glu::checkError(err,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x8fb);
    bVar4 = 1;
    lVar12 = 0x10;
    do {
      local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xffffffff);
      (*this->m_pGetNamedBufferParameteriv)
                (local_44,*(GLenum *)((long)&PTR_deinit_020e4c70 + lVar12),(GLint *)&local_40);
      pGVar3 = *(GLchar **)((long)&PTR_iterate_020e4c78 + lVar12);
      bVar8 = CheckParameterError(this,pGVar3,"glGetNamedBufferParameteriv");
      bVar9 = CheckValue<int>(this,(int)local_40,
                              *(int *)((long)&iterate::test_values[0].pname + lVar12),pGVar3,
                              "glGetNamedBufferParameteriv");
      bVar4 = bVar4 & (bVar8 && bVar9);
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0xe8);
    lVar12 = 0x10;
    do {
      local_40 = &DAT_ffffffffffffffff;
      (*this->m_pGetNamedBufferParameteri64v)
                (local_44,*(GLenum *)((long)&PTR_deinit_020e4c70 + lVar12),(GLint64 *)&local_40);
      pGVar3 = *(GLchar **)((long)&PTR_iterate_020e4c78 + lVar12);
      bVar8 = CheckParameterError(this,pGVar3,"glGetNamedBufferParameteri64v");
      bVar9 = CheckValue<long>(this,(long)local_40,
                               (long)*(int *)((long)&iterate::test_values[0].pname + lVar12),pGVar3,
                               "glGetNamedBufferParameteri64v");
      bVar4 = bVar4 & (bVar8 && bVar9);
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0xe8);
    local_40 = &DAT_00000001;
    (*this->m_pGetNamedBufferPointerv)(local_44,0x88bd,&local_40);
    bVar8 = CheckParameterError(this,"GL_BUFFER_MAP_POINTER","glGetNamedBufferPointer");
    bVar9 = CheckValue<void*>(this,local_40,(void *)0x0,"GL_BUFFER_MAP_POINTER",
                              "glGetNamedBufferParameteriv");
    lVar12 = local_38;
    if (local_44 != 0) {
      (**(code **)(local_38 + 0x438))(1);
      local_44 = 0;
    }
    do {
      iVar10 = (**(code **)(lVar12 + 0x800))();
    } while (iVar10 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bool)(bVar4 & (bVar8 && bVar9))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pGetNamedBufferParameteri64v) ||
			(DE_NULL == m_pGetNamedBufferParameteriv) || (DE_NULL == m_pGetNamedBufferPointerv))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Test data for glGetNamedBufferParameteri*v. */
		static const struct
		{
			glw::GLenum		   pname;
			const glw::GLchar* pname_string;
			glw::GLint		   expected_data;
		} test_values[] = { { GL_BUFFER_SIZE, "GL_BUFFER_SIZE", 0 },
							{ GL_BUFFER_USAGE, "GL_BUFFER_USAGE", GL_STATIC_DRAW },
							{ GL_BUFFER_ACCESS, "GL_BUFFER_ACCESS", GL_READ_WRITE },
							{ GL_BUFFER_ACCESS_FLAGS, "GL_BUFFER_ACCESS_FLAGS", 0 },
							{ GL_BUFFER_IMMUTABLE_STORAGE, "GL_BUFFER_IMMUTABLE_STORAGE", GL_FALSE },
							{ GL_BUFFER_MAPPED, "GL_BUFFER_MAPPED", GL_FALSE },
							{ GL_BUFFER_MAP_OFFSET, "GL_BUFFER_MAP_OFFSET", 0 },
							{ GL_BUFFER_MAP_LENGTH, "GL_BUFFER_MAP_LENGTH", 0 },
							{ GL_BUFFER_STORAGE_FLAGS, "GL_BUFFER_STORAGE_FLAGS", 0 } };

		static const glw::GLuint test_dictionary_count = sizeof(test_values) / sizeof(test_values[0]);

		/* Test glGetNamedBufferParameteriv. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint data = -1;

			m_pGetNamedBufferParameteriv(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteriv");

			is_ok &= CheckValue<glw::GLint>(data, test_values[i].expected_data, test_values[i].pname_string,
											"glGetNamedBufferParameteriv");
		}

		/* Test glGetNamedBufferParameteri64v. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint64 data = -1;

			m_pGetNamedBufferParameteri64v(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteri64v");

			is_ok &= CheckValue<glw::GLint64>(data, (glw::GLint64)test_values[i].expected_data,
											  test_values[i].pname_string, "glGetNamedBufferParameteri64v");
		}

		/* Test glGetNamedBufferPointerv. */
		{
			glw::GLvoid* data = (glw::GLvoid*)1;

			m_pGetNamedBufferPointerv(buffer, GL_BUFFER_MAP_POINTER, &data);

			is_ok &= CheckParameterError("GL_BUFFER_MAP_POINTER", "glGetNamedBufferPointer");

			is_ok &= CheckValue<glw::GLvoid*>(data, (glw::GLvoid*)DE_NULL, "GL_BUFFER_MAP_POINTER",
											  "glGetNamedBufferParameteriv");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}